

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryCamera(AssbinExport *this,IOStream *container,aiCamera *cam)

{
  AssbinChunkWriter chunk;
  
  chunk.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00758758;
  chunk.buffer = (uint8_t *)0x0;
  chunk.magic = 0x1234;
  chunk.cur_size = 0;
  chunk.cursor = 0;
  chunk.initial = 0x1000;
  chunk.container = container;
  Write<aiString>(&chunk.super_IOStream,&cam->mName);
  Write<aiVector3t<float>>(&chunk.super_IOStream,&cam->mPosition);
  Write<aiVector3t<float>>(&chunk.super_IOStream,&cam->mLookAt);
  Write<aiVector3t<float>>(&chunk.super_IOStream,&cam->mUp);
  (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&cam->mHorizontalFOV,4,1);
  (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&cam->mClipPlaneNear,4,1);
  (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&cam->mClipPlaneFar,4,1);
  (*chunk.super_IOStream._vptr_IOStream[3])(&chunk,&cam->mAspect,4,1);
  AssbinChunkWriter::~AssbinChunkWriter(&chunk);
  return;
}

Assistant:

void WriteBinaryCamera( IOStream * container, const aiCamera* cam )
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AICAMERA );

        Write<aiString>(&chunk,cam->mName);
        Write<aiVector3D>(&chunk,cam->mPosition);
        Write<aiVector3D>(&chunk,cam->mLookAt);
        Write<aiVector3D>(&chunk,cam->mUp);
        Write<float>(&chunk,cam->mHorizontalFOV);
        Write<float>(&chunk,cam->mClipPlaneNear);
        Write<float>(&chunk,cam->mClipPlaneFar);
        Write<float>(&chunk,cam->mAspect);
    }